

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O3

SPxId __thiscall
soplex::SPxHarrisRT<double>::selectEnter
          (SPxHarrisRT<double> *this,double *val,int param_2,bool param_3)

{
  double dVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long *plVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  long *plVar7;
  long *plVar8;
  long *plVar9;
  long *plVar10;
  Real RVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  double *pdVar17;
  undefined4 extraout_var_10;
  long lVar18;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  long lVar19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  _func_int **pp_Var20;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  double dVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  double dVar27;
  double dVar28;
  double dVar29;
  uint local_154;
  double local_148;
  double local_138;
  double max;
  SPxId enterId;
  undefined4 local_108;
  uint uStack_104;
  undefined4 local_f8;
  uint uStack_f4;
  undefined1 local_d8 [16];
  double rmaxabs;
  double cmaxabs;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_8c;
  undefined1 local_88 [16];
  double local_70;
  undefined1 local_68 [16];
  double local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  SSVectorBase<double> *local_38;
  undefined4 extraout_var_11;
  undefined4 extraout_var_29;
  
  enterId.super_DataKey.info = 0;
  enterId.super_DataKey.idx = -1;
  max = 0.0;
  cmaxabs = 1.0;
  rmaxabs = 1.0;
  peVar2 = (this->super_SPxRatioTester<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->super_SPxRatioTester<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    dVar1 = peVar2->s_epsilon_multiplier;
    uVar23 = -(ulong)(dVar1 == 1.0);
    local_d8._0_8_ = ~uVar23 & (ulong)(dVar1 * 0.0001) | uVar23 & 0x3f1a36e2eb1c432d;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    dVar1 = peVar2->s_epsilon_multiplier;
    uVar23 = -(ulong)(dVar1 == 1.0);
    local_d8._0_8_ = ~uVar23 & (ulong)(dVar1 * 0.0001) | uVar23 & 0x3f1a36e2eb1c432d;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  local_d8._8_8_ = 0;
  iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  RVar11 = Tolerances::epsilon(*(Tolerances **)(CONCAT44(extraout_var,iVar13) + 0x1b8));
  local_a8._8_4_ = extraout_XMM0_Dc;
  local_a8._0_8_ = RVar11;
  local_a8._12_4_ = extraout_XMM0_Dd;
  dVar1 = degenerateEps(this);
  iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  plVar3 = *(long **)(CONCAT44(extraout_var_00,iVar13) + 0x6c0);
  iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar4 = *(long *)(CONCAT44(extraout_var_01,iVar13) + 0x6c0);
  local_38 = (SSVectorBase<double> *)(lVar4 + 0x20);
  iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  plVar5 = *(long **)(CONCAT44(extraout_var_02,iVar13) + 0x6b8);
  iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar6 = *(long *)(CONCAT44(extraout_var_03,iVar13) + 0x6b8);
  iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  plVar7 = *(long **)(CONCAT44(extraout_var_04,iVar13) + 0x6d8);
  iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  plVar8 = *(long **)(CONCAT44(extraout_var_05,iVar13) + 0x6e0);
  iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  plVar9 = *(long **)(CONCAT44(extraout_var_06,iVar13) + 0x6e8);
  iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  plVar10 = *(long **)(CONCAT44(extraout_var_07,iVar13) + 0x6f0);
  iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  SSVectorBase<double>::setup
            ((SSVectorBase<double> *)(*(long *)(CONCAT44(extraout_var_08,iVar13) + 0x6b8) + 0x20));
  iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  SSVectorBase<double>::setup
            ((SSVectorBase<double> *)(*(long *)(CONCAT44(extraout_var_09,iVar13) + 0x6c0) + 0x20));
  local_108 = SUB84(dVar1,0);
  uStack_104 = (uint)((ulong)dVar1 >> 0x20);
  if (*val <= (double)local_a8._0_8_) {
    local_148 = 0.0;
    if (*val < -(double)local_a8._0_8_) {
      pdVar17 = (double *)__tls_get_addr(&PTR_003b4b70);
      local_58 = *pdVar17;
      uStack_94 = uStack_104 ^ 0x80000000;
      uStack_8c = extraout_XMM0_Dd_00 ^ 0x80000000;
      local_98 = local_108;
LAB_00236c33:
      do {
        do {
          max = *val;
          iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
          local_70 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_23,iVar13) + 0x368))
                                       ((long *)CONCAT44(extraout_var_23,iVar13));
          minDelta(this,&rmaxabs,&max,*(int *)(lVar4 + 0x28),*(int **)(lVar4 + 0x30),
                   *(double **)(lVar4 + 0x40),(double *)*plVar3,(double *)*plVar8,(double *)*plVar7)
          ;
          minDelta(this,&cmaxabs,&max,*(int *)(lVar6 + 0x28),*(int **)(lVar6 + 0x30),
                   *(double **)(lVar6 + 0x40),(double *)*plVar5,(double *)*plVar10,(double *)*plVar9
                  );
          if ((max == *val) && (!NAN(max) && !NAN(*val))) {
            return (SPxId)enterId.super_DataKey;
          }
          ::soplex::infinity::__tls_init();
          local_88._8_8_ = 0;
          local_88._0_8_ = cmaxabs * (double)local_a8._0_8_;
          local_154 = 0xffffffff;
          if ((long)*(int *)(lVar4 + 0x28) < 1) {
            local_138 = 0.0;
            uVar15 = 0xffffffff;
            local_148 = local_58;
          }
          else {
            local_68._0_8_ = rmaxabs * (double)local_a8._0_8_ * 0.001;
            local_68._8_8_ = 0;
            local_48._8_8_ = 0x8000000000000000;
            local_48._0_8_ = -(double)local_68._0_8_;
            uVar23 = (long)*(int *)(lVar4 + 0x28) + 1;
            uVar15 = 0xffffffff;
            local_138 = 0.0;
            local_148 = local_58;
            do {
              lVar19 = *(long *)(lVar4 + 0x30);
              uVar16 = *(uint *)(lVar19 + -8 + uVar23 * 4);
              lVar21 = (long)(int)uVar16;
              dVar27 = *(double *)(*(long *)(lVar4 + 0x40) + lVar21 * 8);
              if (dVar27 <= (double)local_68._0_8_) {
                if ((double)local_48._0_8_ <= dVar27) {
                  *(undefined8 *)(*(long *)(lVar4 + 0x40) + lVar21 * 8) = 0;
                  iVar13 = *(int *)(lVar4 + 0x28);
                  *(int *)(lVar4 + 0x28) = iVar13 + -1;
                  *(undefined4 *)(lVar19 + -8 + uVar23 * 4) =
                       *(undefined4 *)(lVar19 + -4 + (long)iVar13 * 4);
                }
                else {
                  dVar24 = *(double *)(*plVar7 + lVar21 * 8) - *(double *)(*plVar3 + lVar21 * 8);
                  if (dVar24 < (double)CONCAT44(uStack_94,local_98)) {
                    iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
                    lVar18 = CONCAT44(extraout_var_25,iVar13);
                    dVar27 = *(double *)(*plVar3 + lVar21 * 8);
                    uVar25 = SUB84(dVar27,0);
                    uVar26 = (undefined4)((ulong)dVar27 >> 0x20);
                    lVar19 = **(long **)(lVar18 + 0x6d8);
                    dVar24 = *(double *)(lVar19 + lVar21 * 8);
                    dVar29 = dVar27 - dVar24;
                    dVar27 = (double)-(ulong)(dVar24 < dVar27);
                    goto LAB_00236e84;
                  }
                  dVar24 = dVar24 / dVar27;
                  if ((max <= dVar24) && (local_138 < -dVar27)) {
                    pp_Var20 = (this->super_SPxRatioTester<double>)._vptr_SPxRatioTester;
                    local_148 = dVar24;
                    local_138 = -dVar27;
                    goto LAB_00236f2b;
                  }
                }
              }
              else {
                dVar24 = *(double *)(*plVar8 + lVar21 * 8) - *(double *)(*plVar3 + lVar21 * 8);
                if (dVar1 < dVar24) {
                  iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
                  lVar18 = CONCAT44(extraout_var_24,iVar13);
                  dVar24 = *(double *)(*plVar3 + lVar21 * 8);
                  uVar25 = SUB84(dVar24,0);
                  uVar26 = (undefined4)((ulong)dVar24 >> 0x20);
                  lVar19 = **(long **)(lVar18 + 0x6e0);
                  dVar27 = *(double *)(lVar19 + lVar21 * 8);
                  dVar29 = (double)-(ulong)(dVar24 < dVar27);
                  dVar27 = dVar27 - dVar24;
LAB_00236e84:
                  *(double *)(lVar18 + 0x380) =
                       (double)((ulong)dVar27 & (ulong)dVar29) + *(double *)(lVar18 + 0x380);
                  *(ulong *)(lVar19 + lVar21 * 8) = CONCAT44(uVar26,uVar25);
                }
                else {
                  dVar24 = dVar24 / dVar27;
                  if ((max <= dVar24) && (local_138 < dVar27)) {
                    pp_Var20 = (this->super_SPxRatioTester<double>)._vptr_SPxRatioTester;
                    local_148 = dVar24;
                    local_138 = dVar27;
LAB_00236f2b:
                    iVar13 = (*pp_Var20[3])(this);
                    enterId = SPxSolverBase<double>::id
                                        ((SPxSolverBase<double> *)CONCAT44(extraout_var_26,iVar13),
                                         uVar16);
                    uVar15 = uVar16;
                  }
                }
              }
              uVar23 = uVar23 - 1;
            } while (1 < uVar23);
          }
          if (0 < (long)*(int *)(lVar6 + 0x28)) {
            uVar25 = local_88._8_4_;
            uVar16 = local_88._12_4_;
            dVar27 = local_88._0_8_ * 0.001;
            local_88._8_4_ = uVar25;
            local_88._0_8_ = dVar27;
            local_88._12_4_ = uVar16;
            local_68._8_4_ = uVar25;
            local_68._0_8_ = -dVar27;
            local_68._12_4_ = uVar16 ^ 0x80000000;
            local_154 = 0xffffffff;
            uVar23 = (long)*(int *)(lVar6 + 0x28);
            do {
              lVar19 = *(long *)(lVar6 + 0x30);
              iVar13 = *(int *)(lVar19 + -4 + uVar23 * 4);
              lVar21 = (long)iVar13;
              dVar27 = *(double *)(*(long *)(lVar6 + 0x40) + lVar21 * 8);
              if (dVar27 <= (double)local_88._0_8_) {
                if ((double)local_68._0_8_ <= dVar27) {
                  *(undefined8 *)(*(long *)(lVar6 + 0x40) + lVar21 * 8) = 0;
                  iVar13 = *(int *)(lVar6 + 0x28);
                  *(int *)(lVar6 + 0x28) = iVar13 + -1;
                  *(undefined4 *)(lVar19 + -4 + uVar23 * 4) =
                       *(undefined4 *)(lVar19 + -4 + (long)iVar13 * 4);
                }
                else {
                  dVar24 = *(double *)(*plVar9 + lVar21 * 8) - *(double *)(*plVar5 + lVar21 * 8);
                  if (dVar24 < (double)CONCAT44(uStack_94,local_98)) {
                    iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
                    lVar18 = CONCAT44(extraout_var_28,iVar13);
                    dVar27 = *(double *)(*plVar5 + lVar21 * 8);
                    uVar25 = SUB84(dVar27,0);
                    uVar26 = (undefined4)((ulong)dVar27 >> 0x20);
                    lVar19 = **(long **)(lVar18 + 0x6e8);
                    dVar24 = *(double *)(lVar19 + lVar21 * 8);
                    dVar29 = dVar27 - dVar24;
                    dVar27 = (double)-(ulong)(dVar24 < dVar27);
                    goto LAB_002370df;
                  }
                  dVar24 = dVar24 / dVar27;
                  if ((max <= dVar24) && (local_138 < -dVar27)) {
                    pp_Var20 = (this->super_SPxRatioTester<double>)._vptr_SPxRatioTester;
                    local_148 = dVar24;
                    local_138 = -dVar27;
                    goto LAB_0023717a;
                  }
                }
              }
              else {
                dVar24 = *(double *)(*plVar10 + lVar21 * 8) - *(double *)(*plVar5 + lVar21 * 8);
                if (dVar24 <= dVar1) {
                  dVar24 = dVar24 / dVar27;
                  if ((max <= dVar24) && (local_138 < dVar27)) {
                    pp_Var20 = (this->super_SPxRatioTester<double>)._vptr_SPxRatioTester;
                    local_148 = dVar24;
                    local_138 = dVar27;
LAB_0023717a:
                    iVar14 = (*pp_Var20[3])(this);
                    enterId = SPxSolverBase<double>::coId
                                        ((SPxSolverBase<double> *)CONCAT44(extraout_var_29,iVar14),
                                         iVar13);
                    local_154 = (uint)(uVar23 - 1);
                  }
                }
                else {
                  iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
                  lVar18 = CONCAT44(extraout_var_27,iVar13);
                  dVar24 = *(double *)(*plVar5 + lVar21 * 8);
                  uVar25 = SUB84(dVar24,0);
                  uVar26 = (undefined4)((ulong)dVar24 >> 0x20);
                  lVar19 = **(long **)(lVar18 + 0x6f0);
                  dVar27 = *(double *)(lVar19 + lVar21 * 8);
                  dVar29 = (double)-(ulong)(dVar24 < dVar27);
                  dVar27 = dVar27 - dVar24;
LAB_002370df:
                  *(double *)(lVar18 + 0x380) =
                       (double)((ulong)dVar27 & (ulong)dVar29) + *(double *)(lVar18 + 0x380);
                  *(ulong *)(lVar19 + lVar21 * 8) = CONCAT44(uVar26,uVar25);
                }
              }
              bVar12 = 1 < uVar23;
              uVar23 = uVar23 - 1;
            } while (bVar12);
          }
          iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
          dVar27 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_30,iVar13) + 0x368))
                                     ((long *)CONCAT44(extraout_var_30,iVar13));
        } while ((local_70 != dVar27) || (NAN(local_70) || NAN(dVar27)));
        if (-1 < (int)local_154) {
          iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
          bVar12 = SPxSolverBase<double>::isBasic
                             ((SPxSolverBase<double> *)CONCAT44(extraout_var_31,iVar13),&enterId);
          if (!bVar12) break;
          lVar19 = *(long *)(lVar6 + 0x30);
          *(undefined8 *)
           (*(long *)(lVar6 + 0x40) + (long)*(int *)(lVar19 + (ulong)local_154 * 4) * 8) = 0;
          iVar13 = *(int *)(lVar6 + 0x28);
          *(int *)(lVar6 + 0x28) = iVar13 + -1;
          *(undefined4 *)(lVar19 + (ulong)local_154 * 4) =
               *(undefined4 *)(lVar19 + -4 + (long)iVar13 * 4);
          goto LAB_00236c33;
        }
        if ((int)uVar15 < 0) goto LAB_002374a1;
        iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
        lVar19 = *(long *)(CONCAT44(extraout_var_32,iVar13) + 0x480);
        lVar21 = *(long *)(lVar19 + 0x20);
        uVar23 = (ulong)uVar15;
        lVar19 = (long)*(int *)(*(long *)(lVar19 + 0x28) + 4 + uVar23 * 8);
        iVar13 = *(int *)(lVar21 + 0xc + lVar19 * 0x28);
        if (iVar13 < 1) {
          dVar27 = 0.0;
        }
        else {
          pdVar17 = *(double **)(lVar21 + lVar19 * 0x28);
          uVar16 = iVar13 + 1;
          dVar29 = 0.0;
          dVar24 = 0.0;
          do {
            dVar28 = *pdVar17 * *(double *)(*plVar5 + (long)*(int *)(pdVar17 + 1) * 8);
            dVar27 = dVar24 + dVar28;
            dVar29 = dVar29 + (dVar28 - (dVar27 - dVar24)) + (dVar24 - (dVar27 - (dVar27 - dVar24)))
            ;
            pdVar17 = pdVar17 + 2;
            uVar16 = uVar16 - 1;
            dVar24 = dVar27;
          } while (1 < uVar16);
          dVar27 = dVar27 + dVar29;
        }
        *(double *)(*plVar3 + uVar23 * 8) = dVar27;
        iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
        bVar12 = SPxSolverBase<double>::isBasic
                           ((SPxSolverBase<double> *)CONCAT44(extraout_var_33,iVar13),&enterId);
        if (bVar12) {
          SSVectorBase<double>::setValue(local_38,uVar15,0.0);
          goto LAB_00236c33;
        }
        dVar27 = *(double *)(*(long *)(lVar4 + 0x40) + uVar23 * 8);
        local_148 = *(double *)(*plVar3 + uVar23 * 8);
        if (dVar27 <= 0.0) {
          local_148 = *(double *)(*plVar7 + uVar23 * 8) - local_148;
          if ((-dVar27 < (double)local_d8._0_8_) &&
             (local_148 < (this->super_SPxRatioTester<double>).delta)) {
            iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
            lVar21 = CONCAT44(extraout_var_35,iVar13);
            dVar27 = *(double *)(*plVar3 + uVar23 * 8);
            uVar25 = SUB84(dVar27,0);
            uVar26 = (undefined4)((ulong)dVar27 >> 0x20);
            lVar19 = **(long **)(lVar21 + 0x6d8);
            dVar24 = *(double *)(lVar19 + uVar23 * 8);
            dVar29 = dVar27 - dVar24;
            dVar27 = (double)-(ulong)(dVar24 < dVar27);
            goto LAB_00237443;
          }
        }
        else {
          local_148 = *(double *)(*plVar8 + uVar23 * 8) - local_148;
          if ((dVar27 < (double)local_d8._0_8_) &&
             (-local_148 < (this->super_SPxRatioTester<double>).delta)) {
            iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
            lVar21 = CONCAT44(extraout_var_34,iVar13);
            dVar24 = *(double *)(*plVar3 + uVar23 * 8);
            uVar25 = SUB84(dVar24,0);
            uVar26 = (undefined4)((ulong)dVar24 >> 0x20);
            lVar19 = **(long **)(lVar21 + 0x6e0);
            dVar27 = *(double *)(lVar19 + uVar23 * 8);
            dVar29 = (double)-(ulong)(dVar24 < dVar27);
            dVar27 = dVar27 - dVar24;
LAB_00237443:
            *(double *)(lVar21 + 0x380) =
                 (double)((ulong)dVar27 & (ulong)dVar29) + *(double *)(lVar21 + 0x380);
            *(ulong *)(lVar19 + uVar23 * 8) = CONCAT44(uVar26,uVar25);
            uVar25 = local_d8._12_4_;
            local_d8._8_4_ = local_d8._8_4_;
            local_d8._0_8_ = (double)local_d8._0_8_ * 0.5;
            local_d8._12_4_ = uVar25;
            goto LAB_00236c33;
          }
        }
        local_148 = local_148 / dVar27;
      } while (local_148 < max);
    }
  }
  else {
    pdVar17 = (double *)__tls_get_addr(&PTR_003b4b70);
    local_58 = -*pdVar17;
    uStack_50 = 0;
    uStack_4c = 0x80000000;
    local_68._0_8_ = (ulong)dVar1 ^ 0x8000000000000000;
    local_68._8_4_ = local_f8;
    local_68._12_4_ = uStack_f4 ^ 0x80000000;
LAB_0023638a:
    do {
      do {
        max = *val;
        iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
        dVar27 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_10,iVar13) + 0x368))
                                   ((long *)CONCAT44(extraout_var_10,iVar13));
        maxDelta(this,&rmaxabs,&max,*(int *)(lVar4 + 0x28),*(int **)(lVar4 + 0x30),
                 *(double **)(lVar4 + 0x40),(double *)*plVar3,(double *)*plVar8,(double *)*plVar7);
        maxDelta(this,&cmaxabs,&max,*(int *)(lVar6 + 0x28),*(int **)(lVar6 + 0x30),
                 *(double **)(lVar6 + 0x40),(double *)*plVar5,(double *)*plVar10,(double *)*plVar9);
        if ((max == *val) && (!NAN(max) && !NAN(*val))) {
          return (SPxId)enterId.super_DataKey;
        }
        ::soplex::infinity::__tls_init();
        local_70 = cmaxabs * 0.001;
        local_98 = 0xffffffff;
        dVar24 = (double)local_a8._0_8_;
        uVar23 = local_a8._8_8_;
        if ((long)*(int *)(lVar4 + 0x28) < 1) {
          local_138 = 0.0;
          local_154 = 0xffffffff;
          local_148 = local_58;
        }
        else {
          dVar29 = rmaxabs * 0.001 * (double)local_a8._0_8_;
          local_88._0_8_ = local_a8._0_8_;
          if ((double)local_a8._0_8_ <= dVar29) {
            local_88._0_8_ = dVar29;
          }
          local_88._8_8_ = local_a8._8_8_;
          local_48._8_8_ = local_a8._8_8_ ^ 0x8000000000000000;
          local_48._0_8_ = -(double)local_88._0_8_;
          uVar22 = (long)*(int *)(lVar4 + 0x28) + 1;
          local_154 = 0xffffffff;
          local_138 = 0.0;
          local_148 = local_58;
          do {
            lVar19 = *(long *)(lVar4 + 0x30);
            uVar15 = *(uint *)(lVar19 + -8 + uVar22 * 4);
            lVar21 = (long)(int)uVar15;
            dVar29 = *(double *)(*(long *)(lVar4 + 0x40) + lVar21 * 8);
            if (dVar29 <= (double)local_88._0_8_) {
              if ((double)local_48._0_8_ <= dVar29) {
                *(undefined8 *)(*(long *)(lVar4 + 0x40) + lVar21 * 8) = 0;
                iVar13 = *(int *)(lVar4 + 0x28);
                *(int *)(lVar4 + 0x28) = iVar13 + -1;
                *(undefined4 *)(lVar19 + -8 + uVar22 * 4) =
                     *(undefined4 *)(lVar19 + -4 + (long)iVar13 * 4);
              }
              else {
                dVar28 = *(double *)(*plVar8 + lVar21 * 8) - *(double *)(*plVar3 + lVar21 * 8);
                if (dVar1 < dVar28) {
                  iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
                  lVar18 = CONCAT44(extraout_var_12,iVar13);
                  dVar29 = *(double *)(*plVar3 + lVar21 * 8) + dVar1;
                  lVar19 = **(long **)(lVar18 + 0x6e0);
                  dVar24 = *(double *)(lVar19 + lVar21 * 8);
                  dVar28 = (double)-(ulong)(dVar29 < dVar24);
                  dVar24 = dVar24 - dVar29;
                  goto LAB_002365ee;
                }
                dVar28 = dVar28 / dVar29;
                if (dVar28 <= max) {
                  dVar29 = -dVar29;
                  goto LAB_00236664;
                }
              }
            }
            else {
              dVar28 = *(double *)(*plVar7 + lVar21 * 8) - *(double *)(*plVar3 + lVar21 * 8);
              if (dVar28 < (double)local_68._0_8_) {
                iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
                lVar18 = CONCAT44(extraout_var_11,iVar13);
                dVar29 = *(double *)(*plVar3 + lVar21 * 8) - dVar1;
                lVar19 = **(long **)(lVar18 + 0x6d8);
                dVar24 = *(double *)(lVar19 + lVar21 * 8);
                dVar28 = dVar29 - dVar24;
                dVar24 = (double)-(ulong)(dVar24 < dVar29);
LAB_002365ee:
                *(double *)(lVar18 + 0x380) =
                     (double)((ulong)dVar24 & (ulong)dVar28) + *(double *)(lVar18 + 0x380);
                *(double *)(lVar19 + lVar21 * 8) = dVar29;
                dVar24 = (double)local_a8._0_8_;
                uVar23 = local_a8._8_8_;
              }
              else {
                dVar28 = dVar28 / dVar29;
                if (dVar28 <= max) {
LAB_00236664:
                  if (local_138 <= dVar29) {
                    iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
                    enterId = SPxSolverBase<double>::id
                                        ((SPxSolverBase<double> *)CONCAT44(extraout_var_13,iVar13),
                                         uVar15);
                    dVar24 = (double)local_a8._0_8_;
                    uVar23 = local_a8._8_8_;
                    local_154 = uVar15;
                    local_148 = dVar28;
                    local_138 = dVar29;
                  }
                }
              }
            }
            uVar22 = uVar22 - 1;
          } while (1 < uVar22);
        }
        if (0 < (long)*(int *)(lVar6 + 0x28)) {
          if (dVar24 <= local_70 * dVar24) {
            dVar24 = local_70 * dVar24;
          }
          local_88._8_8_ = uVar23;
          local_88._0_8_ = dVar24;
          local_48._8_4_ = (int)uVar23;
          local_48._0_8_ = -dVar24;
          local_48._12_4_ = (uint)(uVar23 >> 0x20) ^ 0x80000000;
          local_98 = 0xffffffff;
          uVar23 = (long)*(int *)(lVar6 + 0x28);
          do {
            lVar19 = *(long *)(lVar6 + 0x30);
            iVar13 = *(int *)(lVar19 + -4 + uVar23 * 4);
            lVar21 = (long)iVar13;
            dVar24 = *(double *)(*(long *)(lVar6 + 0x40) + lVar21 * 8);
            if (dVar24 <= (double)local_88._0_8_) {
              if ((double)local_48._0_8_ <= dVar24) {
                *(undefined8 *)(*(long *)(lVar6 + 0x40) + lVar21 * 8) = 0;
                iVar13 = *(int *)(lVar6 + 0x28);
                *(int *)(lVar6 + 0x28) = iVar13 + -1;
                *(undefined4 *)(lVar19 + -4 + uVar23 * 4) =
                     *(undefined4 *)(lVar19 + -4 + (long)iVar13 * 4);
              }
              else {
                dVar29 = *(double *)(*plVar10 + lVar21 * 8) - *(double *)(*plVar5 + lVar21 * 8);
                if (dVar1 < dVar29) {
                  iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
                  lVar18 = CONCAT44(extraout_var_15,iVar13);
                  dVar29 = *(double *)(*plVar5 + lVar21 * 8) + dVar1;
                  lVar19 = **(long **)(lVar18 + 0x6f0);
                  dVar24 = *(double *)(lVar19 + lVar21 * 8);
                  dVar28 = (double)-(ulong)(dVar29 < dVar24);
                  dVar24 = dVar24 - dVar29;
                  goto LAB_0023684e;
                }
                dVar29 = dVar29 / dVar24;
                if (dVar29 <= max) {
                  dVar24 = -dVar24;
                  goto LAB_002368bc;
                }
              }
            }
            else {
              dVar29 = *(double *)(*plVar9 + lVar21 * 8) - *(double *)(*plVar5 + lVar21 * 8);
              if ((double)local_68._0_8_ <= dVar29) {
                dVar29 = dVar29 / dVar24;
                if (dVar29 <= max) {
LAB_002368bc:
                  if (local_138 <= dVar24) {
                    iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
                    enterId = SPxSolverBase<double>::coId
                                        ((SPxSolverBase<double> *)CONCAT44(extraout_var_16,iVar14),
                                         iVar13);
                    local_98 = (uint)(uVar23 - 1);
                    local_148 = dVar29;
                    local_138 = dVar24;
                  }
                }
              }
              else {
                iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
                lVar18 = CONCAT44(extraout_var_14,iVar13);
                dVar29 = *(double *)(*plVar5 + lVar21 * 8) - dVar1;
                lVar19 = **(long **)(lVar18 + 0x6e8);
                dVar24 = *(double *)(lVar19 + lVar21 * 8);
                dVar28 = dVar29 - dVar24;
                dVar24 = (double)-(ulong)(dVar24 < dVar29);
LAB_0023684e:
                *(double *)(lVar18 + 0x380) =
                     (double)((ulong)dVar24 & (ulong)dVar28) + *(double *)(lVar18 + 0x380);
                *(double *)(lVar19 + lVar21 * 8) = dVar29;
              }
            }
            bVar12 = 1 < uVar23;
            uVar23 = uVar23 - 1;
          } while (bVar12);
        }
        iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
        dVar24 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_17,iVar13) + 0x368))
                                   ((long *)CONCAT44(extraout_var_17,iVar13));
        uVar15 = local_98;
      } while ((dVar27 != dVar24) || (NAN(dVar27) || NAN(dVar24)));
      if (-1 < (int)local_98) {
        iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
        bVar12 = SPxSolverBase<double>::isBasic
                           ((SPxSolverBase<double> *)CONCAT44(extraout_var_18,iVar13),&enterId);
        if (!bVar12) break;
        lVar19 = *(long *)(lVar6 + 0x30);
        *(undefined8 *)(*(long *)(lVar6 + 0x40) + (long)*(int *)(lVar19 + (ulong)uVar15 * 4) * 8) =
             0;
        iVar13 = *(int *)(lVar6 + 0x28);
        *(int *)(lVar6 + 0x28) = iVar13 + -1;
        *(undefined4 *)(lVar19 + (ulong)uVar15 * 4) =
             *(undefined4 *)(lVar19 + -4 + (long)iVar13 * 4);
        goto LAB_0023638a;
      }
      if ((int)local_154 < 0) {
LAB_002374a1:
        *val = 0.0;
        enterId.super_DataKey = enterId.super_DataKey & 0xffffffff00000000;
        return (SPxId)enterId.super_DataKey;
      }
      iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
      lVar19 = *(long *)(CONCAT44(extraout_var_19,iVar13) + 0x480);
      lVar21 = *(long *)(lVar19 + 0x20);
      uVar23 = (ulong)local_154;
      lVar19 = (long)*(int *)(*(long *)(lVar19 + 0x28) + 4 + uVar23 * 8);
      iVar13 = *(int *)(lVar21 + 0xc + lVar19 * 0x28);
      if (iVar13 < 1) {
        dVar27 = 0.0;
      }
      else {
        pdVar17 = *(double **)(lVar21 + lVar19 * 0x28);
        uVar15 = iVar13 + 1;
        dVar29 = 0.0;
        dVar24 = 0.0;
        do {
          dVar28 = *pdVar17 * *(double *)(*plVar5 + (long)*(int *)(pdVar17 + 1) * 8);
          dVar27 = dVar24 + dVar28;
          dVar29 = dVar29 + (dVar28 - (dVar27 - dVar24)) + (dVar24 - (dVar27 - (dVar27 - dVar24)));
          pdVar17 = pdVar17 + 2;
          uVar15 = uVar15 - 1;
          dVar24 = dVar27;
        } while (1 < uVar15);
        dVar27 = dVar27 + dVar29;
      }
      *(double *)(*plVar3 + uVar23 * 8) = dVar27;
      iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
      bVar12 = SPxSolverBase<double>::isBasic
                         ((SPxSolverBase<double> *)CONCAT44(extraout_var_20,iVar13),&enterId);
      if (bVar12) {
        SSVectorBase<double>::setValue(local_38,local_154,0.0);
        goto LAB_0023638a;
      }
      dVar27 = *(double *)(*(long *)(lVar4 + 0x40) + uVar23 * 8);
      local_148 = *(double *)(*plVar3 + uVar23 * 8);
      if (dVar27 <= 0.0) {
        local_148 = *(double *)(*plVar8 + uVar23 * 8) - local_148;
        if ((-dVar27 < (double)local_d8._0_8_) &&
           (-local_148 < (this->super_SPxRatioTester<double>).delta)) {
          iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
          lVar21 = CONCAT44(extraout_var_22,iVar13);
          dVar27 = *(double *)(*plVar3 + uVar23 * 8);
          uVar25 = SUB84(dVar27,0);
          uVar26 = (undefined4)((ulong)dVar27 >> 0x20);
          lVar19 = **(long **)(lVar21 + 0x6e0);
          dVar24 = *(double *)(lVar19 + uVar23 * 8);
          dVar29 = (double)-(ulong)(dVar27 < dVar24);
          dVar24 = dVar24 - dVar27;
          goto LAB_00236ba6;
        }
      }
      else {
        local_148 = *(double *)(*plVar7 + uVar23 * 8) - local_148;
        if ((dVar27 < (double)local_d8._0_8_) &&
           (local_148 < (this->super_SPxRatioTester<double>).delta)) {
          iVar13 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
          lVar21 = CONCAT44(extraout_var_21,iVar13);
          dVar27 = *(double *)(*plVar3 + uVar23 * 8);
          uVar25 = SUB84(dVar27,0);
          uVar26 = (undefined4)((ulong)dVar27 >> 0x20);
          lVar19 = **(long **)(lVar21 + 0x6d8);
          dVar24 = *(double *)(lVar19 + uVar23 * 8);
          dVar29 = dVar27 - dVar24;
          dVar24 = (double)-(ulong)(dVar24 < dVar27);
LAB_00236ba6:
          *(double *)(lVar21 + 0x380) =
               (double)((ulong)dVar24 & (ulong)dVar29) + *(double *)(lVar21 + 0x380);
          *(ulong *)(lVar19 + uVar23 * 8) = CONCAT44(uVar26,uVar25);
          uVar25 = local_d8._12_4_;
          local_d8._8_4_ = local_d8._8_4_;
          local_d8._0_8_ = (double)local_d8._0_8_ * 0.5;
          local_d8._12_4_ = uVar25;
          goto LAB_0023638a;
        }
      }
      local_148 = local_148 / dVar27;
    } while (max < local_148);
  }
  *val = local_148;
  return (SPxId)enterId.super_DataKey;
}

Assistant:

SPxId SPxHarrisRT<R>::selectEnter(R& val, int, bool)
{
   int i, j;
   SPxId enterId;
   R stab, x, y;
   R max = 0.0;
   R sel = 0.0;
   R lastshift;
   R cuseeps;
   R ruseeps;
   R cmaxabs = 1;
   R rmaxabs = 1;
   int pnr, cnr;

   R minStability = this->tolerances()->scaleAccordingToEpsilon(1e-4);
   R epsilon      = this->solver()->epsilon();
   R degeneps     = degenerateEps();

   VectorBase<R>& pvec = this->solver()->pVec();
   SSVectorBase<R>& pupd = this->solver()->pVec().delta();

   VectorBase<R>& cvec = this->solver()->coPvec();
   SSVectorBase<R>& cupd = this->solver()->coPvec().delta();

   const VectorBase<R>& upb = this->solver()->upBound();
   const VectorBase<R>& lpb = this->solver()->lpBound();
   const VectorBase<R>& ucb = this->solver()->ucBound();
   const VectorBase<R>& lcb = this->solver()->lcBound();

   assert(this->delta > epsilon);
   assert(epsilon > 0);
   assert(this->solver()->maxCycle() > 0);

   this->solver()->coPvec().delta().setup();
   this->solver()->pVec().delta().setup();

   if(val > epsilon)
   {
      for(;;)
      {
         pnr = -1;
         cnr = -1;
         max = val;
         lastshift = this->solver()->shift();
         assert(this->delta > epsilon);

         // phase 1:
         maxDelta(
            &rmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            pupd.size(),         /* # of indices in pupd */
            pupd.indexMem(),     /* nonzero indices in pupd */
            pupd.values(),       /* update VectorBase<R> for vec */
            pvec.get_const_ptr(),                /* current VectorBase<R> */
            lpb.get_const_ptr(),                 /* lower bounds for vec */
            upb.get_const_ptr()                  /* upper bounds for vec */
         );

         maxDelta(
            &cmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            cupd.size(),         /* # of indices in cupd */
            cupd.indexMem(),     /* nonzero indices in cupd */
            cupd.values(),       /* update VectorBase<R> for vec */
            cvec.get_const_ptr(),                /* current VectorBase<R> */
            lcb.get_const_ptr(),                 /* lower bounds for vec */
            ucb.get_const_ptr()                  /* upper bounds for vec */
         );

         if(max == val)
            return enterId;


         // phase 2:
         stab = 0;
         sel = R(-infinity);
         ruseeps = rmaxabs * 0.001 * epsilon;

         if(ruseeps < epsilon)
            ruseeps = epsilon;

         cuseeps = cmaxabs * 0.001 * epsilon;

         if(cuseeps < epsilon)
            cuseeps = epsilon;

         for(j = pupd.size() - 1; j >= 0; --j)
         {
            i = pupd.index(j);
            x = pupd[i];

            if(x > ruseeps)
            {
               y = upb[i] - pvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUPbound(i, pvec[i] - degeneps);
               else
               {
                  y /= x;

                  if(y <= max && x >= stab)        // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = x;
                  }
               }
            }
            else if(x < -ruseeps)
            {
               y = lpb[i] - pvec[i];

               if(y > degeneps)
                  this->solver()->shiftLPbound(i, pvec[i] + degeneps);
               else
               {
                  y /= x;

                  if(y <= max && -x >= stab)       // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI01 removing value {}\n", pupd[i]);
               pupd.clearNum(j);
            }
         }

         for(j = cupd.size() - 1; j >= 0; --j)
         {
            i = cupd.index(j);
            x = cupd[i];

            if(x > cuseeps)
            {
               y = ucb[i] - cvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUCbound(i, cvec[i] - degeneps);
               else
               {
                  y /= x;

                  if(y <= max && x >= stab)        // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = x;
                  }
               }
            }
            else if(x < -cuseeps)
            {
               y = lcb[i] - cvec[i];

               if(y > degeneps)
                  this->solver()->shiftLCbound(i, cvec[i] + degeneps);
               else
               {
                  y /= x;

                  if(y <= max && -x >= stab)       // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI02 removing value {}\n", cupd[i]);
               cupd.clearNum(j);
            }
         }

         if(lastshift == this->solver()->shift())
         {
            if(cnr >= 0)
            {
               if(this->solver()->isBasic(enterId))
               {
                  cupd.clearNum(cnr);
                  continue;
               }
               else
                  break;
            }
            else if(pnr >= 0)
            {
               pvec[pnr] = this->solver()->vector(pnr) * cvec;

               if(this->solver()->isBasic(enterId))
               {
                  pupd.setValue(pnr, 0.0);
                  continue;
               }
               else
               {
                  x = pupd[pnr];

                  if(x > 0)
                  {
                     sel = upb[pnr] - pvec[pnr];

                     if(x < minStability && sel < this->delta)
                     {
                        minStability /= 2.0;
                        this->solver()->shiftUPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }
                  else
                  {
                     sel = lpb[pnr] - pvec[pnr];

                     if(-x < minStability && -sel < this->delta)
                     {
                        minStability /= 2.0;
                        this->solver()->shiftLPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }

                  sel /= x;
               }
            }
            else
            {
               val = 0;
               enterId.inValidate();
               return enterId;
            }

            if(sel > max)              // instability detected => recompute
               continue;               // ratio test with corrected value

            break;
         }
      }
   }
   else if(val < -epsilon)
   {
      for(;;)
      {
         pnr = -1;
         cnr = -1;
         max = val;
         lastshift = this->solver()->shift();
         assert(this->delta > epsilon);


         // phase 1:
         minDelta
         (
            &rmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            pupd.size(),         /* # of indices in pupd */
            pupd.indexMem(),     /* nonzero indices in pupd */
            pupd.values(),       /* update VectorBase<R> for vec */
            pvec.get_const_ptr(),                /* current VectorBase<R> */
            lpb.get_const_ptr(),                 /* lower bounds for vec */
            upb.get_const_ptr()                  /* upper bounds for vec */
         );

         minDelta
         (
            &cmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            cupd.size(),         /* # of indices in cupd */
            cupd.indexMem(),     /* nonzero indices in cupd */
            cupd.values(),       /* update VectorBase<R> for vec */
            cvec.get_const_ptr(),                /* current VectorBase<R> */
            lcb.get_const_ptr(),                 /* lower bounds for vec */
            ucb.get_const_ptr()                  /* upper bounds for vec */
         );

         if(max == val)
            return enterId;


         // phase 2:
         stab = 0;
         sel = R(infinity);
         ruseeps = rmaxabs * epsilon * 0.001;
         cuseeps = cmaxabs * epsilon * 0.001;

         for(j = pupd.size() - 1; j >= 0; --j)
         {
            i = pupd.index(j);
            x = pupd[i];

            if(x > ruseeps)
            {
               y = lpb[i] - pvec[i];

               if(y > degeneps)
                  this->solver()->shiftLPbound(i, pvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && x > stab)         // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = x;
                  }
               }
            }
            else if(x < -ruseeps)
            {
               y = upb[i] - pvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUPbound(i, pvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && -x > stab)        // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI03 removing value {}\n", pupd[i]);
               pupd.clearNum(j);
            }
         }

         for(j = cupd.size() - 1; j >= 0; --j)
         {
            i = cupd.index(j);
            x = cupd[i];

            if(x > cuseeps)
            {
               y = lcb[i] - cvec[i];

               if(y > degeneps)
                  this->solver()->shiftLCbound(i, cvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && x > stab)         // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = x;
                  }
               }
            }
            else if(x < -cuseeps)
            {
               y = ucb[i] - cvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUCbound(i, cvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && -x > stab)        // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI04 removing value {}\n", x);
               cupd.clearNum(j);
            }
         }

         if(lastshift == this->solver()->shift())
         {
            if(cnr >= 0)
            {
               if(this->solver()->isBasic(enterId))
               {
                  cupd.clearNum(cnr);
                  continue;
               }
               else
                  break;
            }
            else if(pnr >= 0)
            {
               pvec[pnr] = this->solver()->vector(pnr) * cvec;

               if(this->solver()->isBasic(enterId))
               {
                  pupd.setValue(pnr, 0.0);
                  continue;
               }
               else
               {
                  x = pupd[pnr];

                  if(x > 0)
                  {
                     sel = lpb[pnr] - pvec[pnr];

                     if(x < minStability && -sel < this->delta)
                     {
                        minStability /= 2;
                        this->solver()->shiftLPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }
                  else
                  {
                     sel = upb[pnr] - pvec[pnr];

                     if(-x < minStability && sel < this->delta)
                     {
                        minStability /= 2;
                        this->solver()->shiftUPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }

                  sel /= x;
               }
            }
            else
            {
               val = 0;
               enterId.inValidate();
               return enterId;
            }

            if(sel < max)              // instability detected => recompute
               continue;               // ratio test with corrected value

            break;
         }
      }
   }

   assert(max * val >= 0);
   assert(enterId.type() != SPxId::INVALID);

   val = sel;

   return enterId;
}